

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall GEO::geofile::merge_physical_surfaces(geofile *this,geofile *secondary_file)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  size_t sVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  pStack_68;
  
  this_00 = &this->physical_surfaces_map;
  sVar1 = (secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (sVar1 != 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator=(&this_00->_M_t,&(secondary_file->physical_surfaces_map)._M_t);
    }
  }
  else if (sVar1 != 0) {
    for (p_Var3 = (secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&this_00->_M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::pair<std::vector<int,_std::allocator<int>_>_&,_true>
                  (&pStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,(vector<int,_std::allocator<int>_> *)(p_Var3 + 2));
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
        ::
        _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                    *)this_00,&pStack_68);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::~pair(&pStack_68);
      }
      else {
        std::vector<int,std::allocator<int>>::
        insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)(iVar2._M_node + 2),
                   (const_iterator)iVar2._M_node[2]._M_parent,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   *(int **)(p_Var3 + 2),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   p_Var3[2]._M_parent);
      }
    }
  }
  return 0;
}

Assistant:

int GEO::geofile::merge_physical_surfaces(geofile &secondary_file)
{
    if (!physical_surfaces_map.empty())
    {
        if(!secondary_file.physical_surfaces_map.empty())
        {
            for (auto i = secondary_file.physical_surfaces_map.begin();
                 i != secondary_file.physical_surfaces_map.end(); i++)
            {
                auto j = physical_surfaces_map.find(i->first);
                auto j_end = physical_surfaces_map.end();
                // Physical name already exists in first map.
                // Append to element.
                if (j!=j_end)
                {
                    j->second.insert(j->second.end(),i->second.begin(), i->second.end());
                }
                // Physical name not in first map
                // Append physical name to first map.
                else
                {
                    physical_surfaces_map.insert({i->first,i->second});
                }
            }
        }
    }
    else
    {
        if (!secondary_file.physical_surfaces_map.empty())
            physical_surfaces_map = secondary_file.physical_surfaces_map;
    }
    return EXIT_SUCCESS;
}